

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAcademicGeoMesh.cpp
# Opt level: O3

TPZGeoMesh * __thiscall TPZAcademicGeoMesh::TetrahedralMesh(TPZAcademicGeoMesh *this)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  TPZGeoMesh *this_00;
  long lVar4;
  int il;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int (*paiVar10) [4];
  TPZManVector<long,_4> elnodes;
  int64_t index;
  long local_130;
  TPZVec<long> local_d8;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  TPZVec<long> local_78;
  long local_58 [4];
  undefined1 local_38 [8];
  
  lVar3 = this->fNumberElements;
  uVar2 = this->fMaterialId;
  this_00 = (TPZGeoMesh *)operator_new(0x2a8);
  TPZGeoMesh::TPZGeoMesh(this_00);
  GenerateNodes(this,this_00);
  this_00->fDim = 3;
  if (0 < lVar3) {
    lVar1 = lVar3 + 1;
    local_130 = 0;
    do {
      lVar6 = 0;
      do {
        lVar8 = lVar6 * lVar1 + local_130;
        lVar6 = lVar6 + 1;
        lVar7 = lVar6 * lVar1 + local_130;
        lVar9 = 0;
        do {
          TPZVec<long>::TPZVec(&local_d8,0);
          local_d8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018b7200;
          local_d8.fStore = &local_b8;
          local_d8.fNElements = 8;
          lVar4 = lVar1 * lVar1 * lVar9;
          local_b8 = lVar8 + lVar4;
          local_d8.fNAlloc = 0;
          local_b0 = lVar8 + 1 + lVar4;
          local_a0 = lVar7 + lVar4;
          local_a8 = lVar4 + lVar7 + 1;
          lVar9 = lVar9 + 1;
          local_88 = lVar1 * lVar1 * lVar9;
          local_98 = lVar8 + local_88;
          local_90 = lVar8 + local_88 + 1;
          local_80 = lVar7 + local_88;
          local_88 = lVar7 + 1 + local_88;
          paiVar10 = tetraedra_2;
          lVar4 = 0;
          do {
            TPZVec<long>::TPZVec(&local_78,0);
            local_78._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01878bc8;
            local_78.fNElements = 4;
            local_78.fNAlloc = 0;
            lVar5 = 0;
            do {
              local_58[lVar5] = local_d8.fStore[(*paiVar10)[lVar5]];
              lVar5 = lVar5 + 1;
            } while (lVar5 != 4);
            local_78.fStore = local_58;
            (*(this_00->super_TPZSavable)._vptr_TPZSavable[0xc])
                      (this_00,4,&local_78,(ulong)uVar2,local_38,1);
            if (local_78.fStore != local_58) {
              local_78.fNAlloc = 0;
              local_78._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
              if (local_78.fStore != (long *)0x0) {
                operator_delete__(local_78.fStore);
              }
            }
            lVar4 = lVar4 + 1;
            paiVar10 = paiVar10 + 1;
          } while (lVar4 != 6);
          if (local_d8.fStore != &local_b8) {
            local_d8.fNAlloc = 0;
            local_d8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
            if (local_d8.fStore != (long *)0x0) {
              operator_delete__(local_d8.fStore);
            }
          }
        } while (lVar9 != lVar3);
      } while (lVar6 != lVar3);
      local_130 = local_130 + 1;
    } while (local_130 != lVar3);
  }
  TPZGeoMesh::BuildConnectivity(this_00);
  AddBoundaryElements(this,this_00);
  if (this->fShouldDeform != false) {
    DeformGMesh(this,this_00);
  }
  return this_00;
}

Assistant:

TPZGeoMesh *TPZAcademicGeoMesh::TetrahedralMesh()
{
    int64_t nelem = fNumberElements;
    int MaterialId = fMaterialId;
    TPZGeoMesh *gmesh = new TPZGeoMesh;
    GenerateNodes(gmesh);
    gmesh->SetDimension(3);
  
    for (int64_t i=0; i<nelem; i++) {
        for (int64_t j=0; j<nelem; j++) {
            for (int64_t k=0; k<nelem; k++) {
                TPZManVector<int64_t,8> nodes(8,0);
                nodes[0] = k*(nelem+1)*(nelem+1)+j*(nelem+1)+i;
                nodes[1] = k*(nelem+1)*(nelem+1)+j*(nelem+1)+i+1;
                nodes[2] = k*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i+1;
                nodes[3] = k*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i;
                nodes[4] = (k+1)*(nelem+1)*(nelem+1)+j*(nelem+1)+i;
                nodes[5] = (k+1)*(nelem+1)*(nelem+1)+j*(nelem+1)+i+1;
                nodes[6] = (k+1)*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i+1;
                nodes[7] = (k+1)*(nelem+1)*(nelem+1)+(j+1)*(nelem+1)+i;
#ifdef PZ_LOG
                if(logger.isDebugEnabled())
                {
                    std::stringstream sout;
                    sout << "Tetrahedral nodes " << nodes;
                    LOGPZ_DEBUG(logger, sout.str())
                }
#endif
                for (int el=0; el<6; el++)
                {
                    TPZManVector<int64_t,4> elnodes(4);
                    int64_t index;
                    for (int il=0; il<4; il++) {
                        elnodes[il] = nodes[tetraedra_2[el][il]];
                    }
                    gmesh->CreateGeoElement(ETetraedro, elnodes, MaterialId, index);
                }
            }
        }
    }
    gmesh->BuildConnectivity();
    AddBoundaryElements(gmesh);
    if (fShouldDeform) {
        DeformGMesh(*gmesh);
    }
    return gmesh;
}